

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

precise_unit units::localityModifiers(string *unit,uint64_t match_flags)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  pointer pcVar4;
  precise_unit pVar5;
  precise_unit pVar6;
  precise_unit pVar7;
  bool bVar8;
  int iVar9;
  size_t sVar10;
  long *plVar11;
  size_type *psVar12;
  ulong uVar13;
  _Alloc_hider _Var14;
  long lVar15;
  bool bVar16;
  precise_unit pVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> nunit;
  string local_c0;
  double local_a0;
  uint64_t local_98;
  long *local_90 [2];
  long local_80 [2];
  string local_70;
  string local_50;
  
  local_a0 = NAN;
  if (2 < unit->_M_string_length) {
    pcVar2 = (unit->_M_dataplus)._M_p;
    if ((*pcVar2 == 'u') && ((pcVar2[1] == 'S' || (pcVar2[1] == 'K')))) {
      *pcVar2 = 'U';
    }
    lVar15 = 8;
    local_98 = match_flags;
    do {
      pcVar2 = *(char **)((long)&wordModifiers::modifiers._M_elems[0x26].
                                 super__Tuple_impl<0UL,_const_char_*,_const_char_*,_unsigned_long,_units::modifier>
                                 .super__Head_base<0UL,_const_char_*,_false>._M_head_impl + lVar15);
      sVar10 = strlen(pcVar2);
      if (sVar10 == 2) {
        iVar9 = strncmp(pcVar2,*(char **)((long)&localityModifiers::internationlReplacements.
                                                 _M_elems[0].first + lVar15),2);
        if (iVar9 != 0) {
LAB_00170f2e:
          pcVar3 = (unit->_M_dataplus)._M_p;
          cVar1 = pcVar3[1];
          if (((('\0' < cVar1) && (iVar9 = isupper((int)cVar1), iVar9 != 0)) &&
              (iVar9 = toupper((int)*pcVar3), iVar9 == *pcVar2)) && (cVar1 == pcVar2[1])) {
            *pcVar3 = (char)iVar9;
          }
          goto LAB_00170f60;
        }
        local_90[0] = local_80;
        std::__cxx11::string::_M_construct((ulong)local_90,'\x01');
        plVar11 = (long *)std::__cxx11::string::append((char *)local_90);
        psVar12 = (size_type *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_c0.field_2._M_allocated_capacity = *psVar12;
          local_c0.field_2._8_8_ = plVar11[3];
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        }
        else {
          local_c0.field_2._M_allocated_capacity = *psVar12;
          local_c0._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_c0._M_string_length = plVar11[1];
        *plVar11 = (long)psVar12;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        uVar13 = (long)unit->_M_string_length - local_c0._M_string_length;
        if ((string *)unit->_M_string_length < local_c0._M_string_length || uVar13 == 0) {
          bVar16 = false;
        }
        else {
          iVar9 = std::__cxx11::string::compare
                            ((ulong)unit,uVar13,(string *)local_c0._M_string_length);
          bVar16 = iVar9 == 0;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
        if (local_90[0] != local_80) {
          operator_delete(local_90[0],local_80[0] + 1);
        }
        if (!bVar16) goto LAB_00170f2e;
      }
      else {
LAB_00170f60:
        strlen(pcVar2);
        uVar13 = std::__cxx11::string::find((char *)unit,(ulong)pcVar2,0);
        if (uVar13 != 0xffffffffffffffff) {
          sVar10 = strlen(pcVar2);
          if (sVar10 == unit->_M_string_length) goto LAB_00170ddf;
          std::__cxx11::string::erase((ulong)unit,uVar13);
          if ((uVar13 != 0) && ((unit->_M_dataplus)._M_p[uVar13 - 1] == '_')) {
            std::__cxx11::string::erase((ulong)unit,uVar13 - 1);
          }
          if ((uVar13 < unit->_M_string_length) && ((unit->_M_dataplus)._M_p[uVar13] == '_')) {
            std::__cxx11::string::erase((ulong)unit,uVar13);
          }
          std::__cxx11::string::push_back((char)unit);
          std::__cxx11::string::append((char *)unit);
          bVar16 = true;
          goto LAB_00171012;
        }
      }
      lVar15 = lVar15 + 0x10;
    } while (lVar15 != 1000);
    bVar16 = false;
LAB_00171012:
    bVar8 = clearEmptySegments(unit);
    if (bVar8 || bVar16) {
      pcVar4 = (unit->_M_dataplus)._M_p;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar4,pcVar4 + unit->_M_string_length);
      pVar17 = unit_from_string_internal(&local_50,local_98 | 0xc00000);
      uVar13 = pVar17._8_8_;
      local_a0 = pVar17.multiplier_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      pVar6.base_units_ = (unit_data)(int)uVar13;
      pVar6.commodity_ = (int)(uVar13 >> 0x20);
      pVar6.multiplier_ = local_a0;
      pVar17.base_units_ = (unit_data)(int)uVar13;
      pVar17.commodity_ = (int)(uVar13 >> 0x20);
      pVar17.multiplier_ = local_a0;
      if (((uint)local_98 >> 0x16 & 1) != 0) {
        return pVar17;
      }
      if (!NAN(local_a0) && (uVar13 & 0xffffffff) != 0xfa94a488) {
        return pVar6;
      }
      uVar13 = local_98 | 0x400000;
      pcVar4 = (unit->_M_dataplus)._M_p;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar4,pcVar4 + unit->_M_string_length);
      pVar17 = localityModifiers(&local_70,uVar13);
      _Var14._M_p = local_70._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p == &local_70.field_2) {
        return pVar17;
      }
LAB_001710fe:
      local_a0 = pVar17.multiplier_;
      operator_delete(_Var14._M_p,local_70.field_2._M_allocated_capacity + 1);
      pVar7.base_units_ = (unit_data)(int)pVar17._8_8_;
      pVar7.commodity_ = (int)((ulong)pVar17._8_8_ >> 0x20);
      pVar7.multiplier_ = local_a0;
      return pVar7;
    }
    if (3 < unit->_M_string_length) {
      lVar15 = 0;
      do {
        pcVar2 = *(char **)((long)localityModifiers::rotSequences._M_elems + lVar15);
        iVar9 = std::__cxx11::string::compare((ulong)unit,0,(char *)0x2);
        if (iVar9 == 0) {
          std::__cxx11::string::substr((ulong)&local_c0,(ulong)unit);
          if ((local_c0._M_dataplus._M_p + -1)[local_c0._M_string_length] == 's') {
            std::__cxx11::string::pop_back();
          }
          std::__cxx11::string::push_back((char)&local_c0);
          std::__cxx11::string::append((char *)&local_c0);
          pVar17 = get_unit(&local_c0,local_98);
          local_70.field_2._M_allocated_capacity = local_c0.field_2._M_allocated_capacity;
          _Var14._M_p = local_c0._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p == &local_c0.field_2) {
            return pVar17;
          }
          goto LAB_001710fe;
        }
        std::__cxx11::string::string((string *)&local_c0,pcVar2,(allocator *)local_90);
        uVar13 = (long)unit->_M_string_length - local_c0._M_string_length;
        if ((string *)unit->_M_string_length < local_c0._M_string_length || uVar13 == 0) {
          bVar16 = false;
        }
        else {
          iVar9 = std::__cxx11::string::compare
                            ((ulong)unit,uVar13,(string *)local_c0._M_string_length);
          bVar16 = iVar9 == 0;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
        if (bVar16) {
          std::__cxx11::string::_M_replace_aux((ulong)unit,unit->_M_string_length - 2,0,'\x01');
          pVar17 = get_unit(unit,local_98);
          return pVar17;
        }
        lVar15 = lVar15 + 8;
      } while (lVar15 != 0x38);
    }
  }
LAB_00170ddf:
  pVar5.base_units_ = (unit_data)0xfa94a488;
  pVar5.commodity_ = 0;
  pVar5.multiplier_ = local_a0;
  return pVar5;
}

Assistant:

static precise_unit
    localityModifiers(std::string unit, std::uint64_t match_flags)
{
    static UNITS_CPP14_CONSTEXPR_OBJECT std::array<ckpair, 62>
        internationlReplacements{{
            ckpair{"internationaltable", "IT"},
            ckpair{"internationalsteamtable", "IT"},
            ckpair{"international", "i"},
            ckpair{"USandBritish", "av"},
            ckpair{"US&British", "av"},
            ckpair{"USAsurvey", "US"},
            ckpair{"USsurvey", "US"},
            ckpair{"USSurvey", "US"},
            ckpair{"USdry", "US"},
            ckpair{"USA", "US"},
            ckpair{"USstatute", "US"},
            ckpair{"statutory", "US"},
            ckpair{"statute", "US"},
            ckpair{"US", "US"},
            ckpair{"shipping", "ship"},
            ckpair{"gregorian", "g"},
            ckpair{"Gregorian", "g"},
            ckpair{"synodic", "s"},
            ckpair{"sidereal", "sdr"},
            ckpair{"julian", "j"},
            ckpair{"Julian", "j"},
            ckpair{"thermochemical", "th"},
            ckpair{"hydraulic", "mech"},
            ckpair{"Th", "th"},
            ckpair{"(th)", "th"},
            ckpair{"metric", "m"},
            ckpair{"mean", "m"},
            ckpair{"imperial", "br"},
            ckpair{"Imperial", "br"},
            ckpair{"English", "br"},
            ckpair{"imp", "br"},
            ckpair{"wine", "wine"},
            ckpair{"beer", "wine"},
            ckpair{"(IT)", "IT"},
            ckpair{"troy", "tr"},
            ckpair{"apothecary", "ap"},
            ckpair{"apothecaries", "ap"},
            ckpair{"avoirdupois", "av"},
            ckpair{"Chinese", "cn"},
            ckpair{"chinese", "cn"},
            ckpair{"Canadian", "ca"},
            ckpair{"canadian", "ca"},
            ckpair{"survey", "US"},
            ckpair{"tropical", "t"},
            ckpair{"British", "br"},
            ckpair{"british", "br"},
            ckpair{"Br", "br"},
            ckpair{"BR", "br"},
            ckpair{"UK", "br"},
            ckpair{"conventional", "90"},
            ckpair{"AC", "ac"},
            ckpair{"DC", "dc"},
            ckpair{"fluid", "FL"},
            ckpair{"liquid", "FL"},
            ckpair{"fl", "FL"},
            ckpair{"15degC", "[15]"},
            ckpair{"20degC", "[20]"},
            ckpair{"59degF", "[59]"},
            ckpair{"60degF", "[60]"},
            ckpair{"39degF", "[39]"},
            ckpair{"0degC", "[00]"},
            // this should be last

            ckpair{"us", "US"},
        }};
    if (unit.size() < 3) {
        return precise::invalid;
    }
    if (unit.front() == 'u' && (unit[1] == 'S' || unit[1] == 'K')) {
        unit.front() = 'U';
    }
    bool changed = false;
    for (const auto& irep : internationlReplacements) {
        if (strlen(irep.first) == 2) {
            if (strncmp(irep.first, irep.second, 2) == 0) {
                if (ends_with(unit, std::string(1, '_') + irep.second)) {
                    continue;
                }
            }
            if (unit[1] > 0 && (std::isupper(unit[1]) != 0) &&
                (std::toupper(unit[0]) == irep.first[0]) &&
                (unit[1] == irep.first[1])) {
                unit[0] = std::toupper(unit[0]);
            }
        }
        auto fnd = unit.find(irep.first);
        if (fnd != std::string::npos) {
            auto len = strlen(irep.first);
            if (len == unit.size()) {  // this is a modifier if we are checking
                                       // the entire unit this is automatically
                                       // false
                return precise::invalid;
            }
            unit.erase(fnd, len);
            if (fnd > 0 && unit[fnd - 1] == '_') {
                unit.erase(fnd - 1, 1);
            }
            if (fnd < unit.size() && unit[fnd] == '_') {
                unit.erase(fnd, 1);
            }
            unit.push_back('_');
            unit.append(irep.second);
            changed = true;
            break;
        }
    }
    changed |= clearEmptySegments(unit);
    if (changed) {
        auto retunit = unit_from_string_internal(
            unit, match_flags | no_locality_modifiers | no_of_operator);
        if (is_error(retunit) && ((match_flags & no_locality_modifiers) == 0)) {
            return localityModifiers(unit, match_flags | no_locality_modifiers);
        }
        return retunit;
    }
    if (unit.size() < 4) {
        return precise::invalid;
    }
    static constexpr std::array<const char*, 7> rotSequences{
        {"br", "av", "ch", "IT", "th", "ap", "tr"}};
    for (const auto& seq : rotSequences) {
        if (unit.compare(0, 2, seq) == 0) {
            auto nunit = unit.substr((unit[3] == '_') ? 3 : 2);
            if (nunit.back() == 's') {
                nunit.pop_back();
            }
            nunit.push_back('_');
            nunit.append(seq);
            return get_unit(nunit, match_flags);
        }
        if (ends_with(unit, seq)) {
            unit.insert(unit.end() - 2, '_');
            return get_unit(unit, match_flags);
        }
    }

    return precise::invalid;
}